

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O2

void chapter1::demo2_cstyle(void)

{
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  ostream *poVar4;
  char user_name [10];
  char local_12 [10];
  
  std::operator<<((ostream *)&std::cout,"Please enter your name: ");
  lVar1 = std::cin;
  *(uint *)(_ITM_registerTMCloneTable + *(long *)(std::cin + -0x18)) =
       *(uint *)(_ITM_registerTMCloneTable + *(long *)(std::cin + -0x18)) & 0xffffefff;
  *(undefined8 *)(__gmon_start__ + *(long *)(lVar1 + -0x18)) = 10;
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,local_12);
  sVar2 = strlen(local_12);
  if (sVar2 == 9) {
    std::operator<<((ostream *)&std::cout,"Too big\n");
  }
  else {
    if (sVar2 == 1) {
      poVar4 = (ostream *)&std::cout;
      pcVar3 = "The name is too short";
      goto LAB_0010a8b0;
    }
    if (sVar2 == 0) {
      poVar4 = (ostream *)&std::cout;
      pcVar3 = "The user with no name";
      goto LAB_0010a8b0;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Hello, ");
  pcVar3 = local_12;
LAB_0010a8b0:
  poVar4 = std::operator<<(poVar4,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void demo2_cstyle() {
        const int size = 10;
        char user_name[size];

        cout << "Please enter your name: ";
        cin >> noskipws >> setw(size) >> user_name;

        switch (strlen(user_name)) {
            case 0:
                cout << "The user with no name" << endl;
                break;
            case 1:
                cout << "The name is too short" << endl;
                break;
            case 9:
                cout << "Too big\n";
            default:
                cout << "Hello, "
                     << user_name
                     << endl;
                break;
        }
    }